

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QIconModeViewBase::moveItem(QIconModeViewBase *this,int index,QPoint *dest)

{
  qsizetype qVar1;
  qsizetype qVar2;
  QRect *in_RDX;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QListViewItem *item;
  QRect rect;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  QListViewItem *in_stack_ffffffffffffff30;
  Representation *pRVar3;
  undefined1 val;
  QPoint in_stack_ffffffffffffff38;
  QRect *r;
  QBspTree *in_stack_ffffffffffffff40;
  QBspTree *this_00;
  QPoint *in_stack_ffffffffffffff48;
  undefined1 local_78 [24];
  QRect local_60;
  undefined1 local_50 [16];
  QSize local_40;
  QSize local_38;
  undefined8 local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QListViewItem>::operator[]
            ((QList<QListViewItem> *)in_stack_ffffffffffffff30,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = (undefined1  [16])QListViewItem::rect((QListViewItem *)in_stack_ffffffffffffff38);
  QBspTree::removeLeaf
            (in_stack_ffffffffffffff40,(QRect *)in_stack_ffffffffffffff38,
             (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  local_20._0_4_ = in_RDX->x1;
  local_20._4_4_ = in_RDX->y1;
  QListViewItem::move(in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
  this_00 = (QBspTree *)&in_RDI[2].x2;
  r = in_RDX;
  local_38 = QRect::size((QRect *)this_00);
  QRect::QRect(in_RDI,in_stack_ffffffffffffff48,(QSize *)this_00);
  QBspTree::insertLeaf(this_00,r,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  QPoint::QPoint((QPoint *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff28);
  QRect::QRect(in_RDI,in_stack_ffffffffffffff48,(QSize *)this_00);
  QRect::size((QRect *)this_00);
  QRect::QRect(in_RDI,(QPoint *)in_RDX,(QSize *)this_00);
  local_50 = QRect::operator|(&local_60,(QRect *)local_78);
  local_40 = QRect::size((QRect *)this_00);
  in_RDI[1].x2 = (Representation)local_40.wd.m_i;
  in_RDI[1].y2 = (Representation)local_40.ht.m_i;
  qVar1 = QBitArray::size((QBitArray *)in_stack_ffffffffffffff30);
  val = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
  qVar2 = QList<QListViewItem>::size((QList<QListViewItem> *)(in_RDI + 6));
  if (qVar1 != qVar2) {
    pRVar3 = &in_RDI[7].x2;
    QList<QListViewItem>::size((QList<QListViewItem> *)(in_RDI + 6));
    QBitArray::resize((longlong)pRVar3);
    val = (undefined1)((ulong)pRVar3 >> 0x38);
  }
  QBitArray::setBit((QBitArray *)this_00,(qsizetype)r,(bool)val);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::moveItem(int index, const QPoint &dest)
{
    // does not impact on the bintree itself or the contents rect
    QListViewItem *item = &items[index];
    QRect rect = item->rect();

    // move the item without removing it from the tree
    tree.removeLeaf(rect, index);
    item->move(dest);
    tree.insertLeaf(QRect(dest, rect.size()), index);

    // resize the contents area
    contentsSize = (QRect(QPoint(0, 0), contentsSize)|QRect(dest, rect.size())).size();

    // mark the item as moved
    if (moved.size() != items.size())
        moved.resize(items.size());
    moved.setBit(index, true);
}